

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void geopolySvgFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  GeoPoly *p;
  sqlite3_str *p_00;
  uchar *puVar1;
  char *z;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  
  if (0 < argc) {
    p = geopolyFuncParam(context,*argv,(int *)0x0);
    if (p != (GeoPoly *)0x0) {
      p_00 = sqlite3_str_new(context->pOut->db);
      sqlite3_str_appendf(p_00,"<polyline points=");
      uVar2 = 0x27;
      for (lVar3 = 0; lVar3 < p->nVertex; lVar3 = lVar3 + 1) {
        sqlite3_str_appendf(p_00,"%c%g,%g",(double)p->a[lVar3 * 2],(double)p->a[lVar3 * 2 + 1],uVar2
                           );
        uVar2 = 0x20;
      }
      sqlite3_str_appendf(p_00," %g,%g\'",(double)p->a[0],(double)p->a[1],uVar2);
      for (uVar4 = 1; (uint)argc != uVar4; uVar4 = uVar4 + 1) {
        puVar1 = sqlite3_value_text(argv[uVar4]);
        if ((puVar1 != (uchar *)0x0) && (*puVar1 != '\0')) {
          sqlite3_str_appendf(p_00," %s",puVar1);
        }
      }
      sqlite3_str_appendf(p_00,"></polyline>");
      z = sqlite3_str_finish(p_00);
      sqlite3_result_text(context,z,-1,sqlite3_free);
      sqlite3_free(p);
      return;
    }
  }
  return;
}

Assistant:

static void geopolySvgFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p;
  if( argc<1 ) return;
  p = geopolyFuncParam(context, argv[0], 0);
  if( p ){
    sqlite3 *db = sqlite3_context_db_handle(context);
    sqlite3_str *x = sqlite3_str_new(db);
    int i;
    char cSep = '\'';
    sqlite3_str_appendf(x, "<polyline points=");
    for(i=0; i<p->nVertex; i++){
      sqlite3_str_appendf(x, "%c%g,%g", cSep, GeoX(p,i), GeoY(p,i));
      cSep = ' ';
    }
    sqlite3_str_appendf(x, " %g,%g'", GeoX(p,0), GeoY(p,0));
    for(i=1; i<argc; i++){
      const char *z = (const char*)sqlite3_value_text(argv[i]);
      if( z && z[0] ){
        sqlite3_str_appendf(x, " %s", z);
      }
    }
    sqlite3_str_appendf(x, "></polyline>");
    sqlite3_result_text(context, sqlite3_str_finish(x), -1, sqlite3_free);
    sqlite3_free(p);
  }
}